

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqastparser.cpp
# Opt level: O2

void __thiscall SQCompilation::SQParser::checkSuspiciousBracket(SQParser *this)

{
  char *pcVar1;
  uint7 uStack_8;
  char op [2];
  
  if ((((this->_expression_context | SQE_SWITCH) == SQE_ARRAY_ELEM) &&
      ((this->_lex)._prevtoken != 0x2c)) && (((this->_lex)._prevflags & 3) != 0)) {
    uStack_8 = CONCAT16((char)this->_token,6);
    _uStack_8 = (ulong)uStack_8;
    pcVar1 = "access to member";
    if (this->_token == 0x28) {
      pcVar1 = "function call";
    }
    reportDiagnostic(this,0x6c,op,pcVar1);
  }
  return;
}

Assistant:

void SQParser::checkSuspiciousBracket() {
  assert(_token == _SC('(') || _token == _SC('['));
  if (_expression_context == SQE_ARRAY_ELEM || _expression_context == SQE_FUNCTION_ARG) {
    if (_lex._prevtoken != _SC(',')) {
      if (_lex._prevflags & (TF_PREP_EOL | TF_PREP_SPACE)) {
        char op[] = { (char)_token, '\0' };
        reportDiagnostic(DiagnosticsId::DI_SUSPICIOUS_BRACKET, op, _token == _SC('(') ? "function call" : "access to member");
      }
    }
  }
}